

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O1

void __thiscall HEkkDualRHS::setup(HEkkDualRHS *this)

{
  size_type __new_size;
  
  __new_size = (size_type)(this->ekk_instance_->lp_).num_row_;
  std::vector<char,_std::allocator<char>_>::resize(&this->workMark,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->workIndex,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->work_infeasibility,__new_size);
  this->partNum = 0;
  this->partSwitch = 0;
  this->analysis = &this->ekk_instance_->analysis_;
  return;
}

Assistant:

void HEkkDualRHS::setup() {
  const HighsInt numRow = ekk_instance_.lp_.num_row_;
  workMark.resize(numRow);
  workIndex.resize(numRow);
  work_infeasibility.resize(numRow);
  partNum = 0;
  partSwitch = 0;
  analysis = &ekk_instance_.analysis_;
}